

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_util.c
# Opt level: O0

void test_kvtree_util_init(void)

{
  register_test(test_kvtree_util_set_get_bytecount,"test_kvtree_util_set_get_bytecount");
  register_test(test_kvtree_util_set_get_int,"test_kvtree_util_set_get_int");
  register_test(test_kvtree_util_set_get_str,"test_kvtree_util_set_get_str");
  register_test(test_kvtree_util_set_get_unsigned_long,"test_kvtree_util_set_get_unsigned_long");
  register_test(test_kvtree_util_set_get_int64,"test_kvtree_util_set_get_int64");
  register_test(test_kvtree_util_set_get_double,"test_kvtree_util_set_get_double");
  register_test(test_kvtree_util_set_get_ptr,"test_kvtree_util_set_get_ptr");
  return;
}

Assistant:

void test_kvtree_util_init(){
  register_test(test_kvtree_util_set_get_bytecount, "test_kvtree_util_set_get_bytecount");
  register_test(test_kvtree_util_set_get_int, "test_kvtree_util_set_get_int");
  register_test(test_kvtree_util_set_get_str, "test_kvtree_util_set_get_str");
  register_test(test_kvtree_util_set_get_unsigned_long, "test_kvtree_util_set_get_unsigned_long");
  register_test(test_kvtree_util_set_get_int64, "test_kvtree_util_set_get_int64");
  register_test(test_kvtree_util_set_get_double, "test_kvtree_util_set_get_double");
  register_test(test_kvtree_util_set_get_ptr, "test_kvtree_util_set_get_ptr");
}